

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O3

optional<int> __thiscall
ear::GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds
          (GainCalculatorDirectSpeakersImpl *this,SpeakerPosition *position,bool isLfe,double tol)

{
  double dVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  type tVar6;
  double *pdVar7;
  pointer ppVar8;
  double *pdVar9;
  ulong uVar10;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  __i;
  long lVar11;
  pointer ppVar12;
  double dVar13;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> candidates;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_30;
  
  _findCandidates(&local_30,this,position,isLfe,tol);
  ppVar8 = local_30.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)local_30.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_30.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = lVar11 >> 4;
  if (uVar5 == 0) {
    uVar10 = 0;
    uVar5 = 0;
    if (local_30.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start == (pointer)0x0) {
      tVar6.m_initialized = false;
      tVar6._1_3_ = 0;
      tVar6.m_storage = 0;
      return (optional<int>)tVar6;
    }
  }
  else {
    if (uVar5 != 1) {
      if (local_30.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_30.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar3 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ear::GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds(boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>const&,bool,double)::__0>>
                  (local_30.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_30.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar11 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<ear::GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds(boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>const&,bool,double)::__0>>
                    (ppVar8,local_30.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        }
        else {
          ppVar12 = ppVar8 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<ear::GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds(boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>const&,bool,double)::__0>>
                    (ppVar8,ppVar12);
          if (ppVar12 !=
              local_30.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pdVar9 = &ppVar8[0x10].second;
            do {
              iVar2 = ppVar12->first;
              dVar1 = ppVar12->second;
              dVar13 = ppVar12[-1].second;
              ppVar8 = ppVar12;
              pdVar4 = pdVar9;
              if (dVar1 < dVar13) {
                do {
                  pdVar7 = pdVar4;
                  ((pair<int,_double> *)(pdVar7 + -1))->first = *(int *)(pdVar7 + -3);
                  *pdVar7 = dVar13;
                  dVar13 = pdVar7[-4];
                  pdVar4 = pdVar7 + -2;
                } while (dVar1 < dVar13);
                ppVar8 = (pointer)(pdVar7 + -3);
              }
              ppVar8->first = iVar2;
              ppVar8->second = dVar1;
              ppVar12 = ppVar12 + 1;
              pdVar9 = pdVar9 + 2;
            } while (ppVar12 !=
                     local_30.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
      }
      if (ABS((local_30.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second -
              local_30.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start[1].second) <= tol) {
        uVar10 = 0;
        uVar5 = 0;
        goto LAB_0015c766;
      }
    }
    uVar5 = (ulong)(uint)(local_30.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first << 0x20;
    uVar10 = 1;
  }
LAB_0015c766:
  operator_delete(local_30.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_30.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_30.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  return (optional<int>)(type)(uVar10 | uVar5);
}

Assistant:

boost::optional<int>
  GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds(
      const SpeakerPosition& position, bool isLfe, double tol) {
    std::vector<std::pair<int, double>> candidates =
        _findCandidates(position, isLfe, tol);
    if (candidates.size() == 0) {
      return boost::none;
    } else if (candidates.size() == 1) {
      return candidates[0].first;
    } else {
      std::sort(candidates.begin(), candidates.end(),
                [](const std::pair<int, double>& a,
                   const std::pair<int, double>& b) -> bool {
                  return a.second < b.second;
                });
      if (std::abs(candidates[0].second - candidates[1].second) > tol) {
        return candidates[0].first;
      }
    }
    return boost::none;
  }